

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlAttrPtr xmlSchemaGetPropNode(xmlNodePtr node,char *name)

{
  int iVar1;
  xmlAttrPtr local_28;
  xmlAttrPtr prop;
  char *name_local;
  xmlNodePtr node_local;
  
  if ((node != (xmlNodePtr)0x0) && (name != (char *)0x0)) {
    for (local_28 = node->properties; local_28 != (xmlAttrPtr)0x0; local_28 = local_28->next) {
      if ((local_28->ns == (xmlNs *)0x0) &&
         (iVar1 = xmlStrEqual(local_28->name,(xmlChar *)name), iVar1 != 0)) {
        return local_28;
      }
    }
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlSchemaGetPropNode(xmlNodePtr node, const char *name)
{
    xmlAttrPtr prop;

    if ((node == NULL) || (name == NULL))
	return(NULL);
    prop = node->properties;
    while (prop != NULL) {
        if ((prop->ns == NULL) && xmlStrEqual(prop->name, BAD_CAST name))
	    return(prop);
	prop = prop->next;
    }
    return (NULL);
}